

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O2

void load_instrument(YM2413 *chip,UINT32 chan,UINT32 slot,UINT8 *inst)

{
  int slot_00;
  
  set_mul(chip,slot,(uint)*inst);
  slot_00 = slot + 1;
  set_mul(chip,slot_00,(uint)inst[1]);
  set_ksl_tl(chip,chan,(uint)inst[2]);
  set_ksl_wave_fb(chip,chan,(uint)inst[3]);
  set_ar_dr(chip,slot,(uint)inst[4]);
  set_ar_dr(chip,slot_00,(uint)inst[5]);
  set_sl_rr(chip,slot,(uint)inst[6]);
  set_sl_rr(chip,slot_00,(uint)inst[7]);
  return;
}

Assistant:

static void load_instrument(YM2413 *chip, UINT32 chan, UINT32 slot, UINT8* inst )
{
	set_mul         (chip, slot,   inst[0]);
	set_mul         (chip, slot+1, inst[1]);
	set_ksl_tl      (chip, chan,   inst[2]);
	set_ksl_wave_fb (chip, chan,   inst[3]);
	set_ar_dr       (chip, slot,   inst[4]);
	set_ar_dr       (chip, slot+1, inst[5]);
	set_sl_rr       (chip, slot,   inst[6]);
	set_sl_rr       (chip, slot+1, inst[7]);
}